

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Shop::updateMedicineDetails(Shop *this)

{
  pointer pMVar1;
  long lVar2;
  string *psVar3;
  int index;
  Medicine medicine;
  int local_c4;
  undefined1 local_c0 [16];
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "You need to Enter the Medicine id to Edit: So select medicine id from here",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printMedicines(this);
  std::istream::operator>>((istream *)&std::cin,&local_c4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Your selected Medicine is:",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printMedicine(this,local_c4 + -1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"What do you want to update? ",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  Medicine::Medicine((Medicine *)local_c0,
                     (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)local_c4 + -1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Updated Medicine Name:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Updated Medicine Company Name:",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Updated Unit Price:",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,(int *)(local_c0 + 4));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Updated Arrival date:",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_70);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Updated Quantity date:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,(int *)(local_c0 + 8));
  lVar2 = (long)local_c4;
  pMVar1 = (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = &pMVar1[lVar2 + -1].name;
  *(ulong *)((long)(psVar3 + 0xffffffffffffffff) + 0x15) = CONCAT53(local_c0._8_5_,local_c0._5_3_);
  ((Medicine *)((long)(psVar3 + 0xffffffffffffffff) + 0x10U))->id = (int)local_c0._0_5_;
  ((Medicine *)((long)(psVar3 + 0xffffffffffffffff) + 0x10U))->unitePrice =
       (int)(CONCAT35(local_c0._5_3_,local_c0._0_5_) >> 0x20);
  std::__cxx11::string::_M_assign((string *)psVar3);
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].companyName);
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].arrivalDate);
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].expireDate);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Edited. New Medicine List is:",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printMedicines(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void updateMedicineDetails() {
        int index;
        cout << "You need to Enter the Medicine id to Edit: So select medicine id from here" << endl;
        printMedicines();
        cin >> index;
        cout << "Your selected Medicine is:" << endl;
        printMedicine(index - 1);
        cout << "What do you want to update? " << endl;

        Medicine medicine = medicineList[index - 1];

        cout << "Enter Updated Medicine Name:" << endl;
        cin >> medicine.name;
        cout << "Enter Updated Medicine Company Name:" << endl;
        cin >> medicine.companyName;
        cout << "Enter Updated Unit Price:" << endl;
        cin >> medicine.unitePrice;
        cout << "Enter Updated Arrival date:" << endl;
        cin >> medicine.arrivalDate;
        /* cout<<"Enter Updated Expire date:"<<endl;
         cin>>medicine.expireDate;*/
        cout << "Enter Updated Quantity date:" << endl;
        cin >> medicine.quantity;

        medicineList[index - 1] = medicine;

        cout << "Edited. New Medicine List is:" << endl;
        printMedicines();
    }